

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadBarcode.cpp
# Opt level: O0

ImageView * ZXing::SetupLumImageView(ImageView iv,LumImage *lum,ReaderOptions *opts)

{
  undefined8 uVar1;
  anon_class_12_3_4e92c811 projection;
  Binarizer BVar2;
  ImageFormat IVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  invalid_argument *this;
  uint8_t *puVar7;
  ReaderOptions *in_RDX;
  undefined8 *in_RSI;
  ImageView *in_RDI;
  uint8_t *in_stack_00000008;
  ImageFormat IStack0000000000000010;
  int iStack0000000000000014;
  int iStack0000000000000018;
  int iStack000000000000001c;
  int iStack0000000000000020;
  undefined4 uStack0000000000000024;
  LumImage *in_stack_fffffffffffffeb8;
  ImageView *this_00;
  undefined1 local_120 [40];
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff28;
  undefined1 local_a8 [48];
  undefined1 local_78 [48];
  undefined1 local_48 [56];
  ReaderOptions *local_10;
  undefined8 *local_8;
  
  this_00 = in_RDI;
  local_10 = in_RDX;
  local_8 = in_RSI;
  IVar3 = ImageView::format((ImageView *)&stack0x00000008);
  if (IVar3 == None) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Invalid image format");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  BVar2 = ReaderOptions::binarizer(local_10);
  if ((BVar2 == GlobalHistogram) ||
     (BVar2 = ReaderOptions::binarizer(local_10), BVar2 == LocalAverage)) {
    IVar3 = ImageView::format((ImageView *)&stack0x00000008);
    if ((IVar3 == RGB) && (iVar4 = ImageView::pixStride((ImageView *)&stack0x00000008), iVar4 == 3))
    {
      ExtractLum<ZXing::SetupLumImageView(ZXing::ImageView,ZXing::LumImage&,ZXing::ReaderOptions_const&)::__0>
                (local_48,(ImageView *)&stack0x00000008);
      LumImage::operator=((LumImage *)this_00,in_stack_fffffffffffffeb8);
      LumImage::~LumImage((LumImage *)0x22bacd);
    }
    else {
      IVar3 = ImageView::format((ImageView *)&stack0x00000008);
      if ((IVar3 == RGBA) &&
         (iVar4 = ImageView::pixStride((ImageView *)&stack0x00000008), iVar4 == 4)) {
        ExtractLum<ZXing::SetupLumImageView(ZXing::ImageView,ZXing::LumImage&,ZXing::ReaderOptions_const&)::__1>
                  (local_78,(ImageView *)&stack0x00000008);
        LumImage::operator=((LumImage *)this_00,in_stack_fffffffffffffeb8);
        LumImage::~LumImage((LumImage *)0x22bb26);
      }
      else {
        IVar3 = ImageView::format((ImageView *)&stack0x00000008);
        if ((IVar3 == BGR) &&
           (iVar4 = ImageView::pixStride((ImageView *)&stack0x00000008), iVar4 == 3)) {
          ExtractLum<ZXing::SetupLumImageView(ZXing::ImageView,ZXing::LumImage&,ZXing::ReaderOptions_const&)::__2>
                    (local_a8,(ImageView *)&stack0x00000008);
          LumImage::operator=((LumImage *)this_00,in_stack_fffffffffffffeb8);
          LumImage::~LumImage((LumImage *)0x22bb7f);
        }
        else {
          IVar3 = ImageView::format((ImageView *)&stack0x00000008);
          if (IVar3 == Lum) {
            iVar4 = ImageView::pixStride((ImageView *)&stack0x00000008);
            if (iVar4 != 1) {
              ExtractLum<ZXing::SetupLumImageView(ZXing::ImageView,ZXing::LumImage&,ZXing::ReaderOptions_const&)::__4>
                        (local_120,(ImageView *)&stack0x00000008);
              LumImage::operator=((LumImage *)this_00,in_stack_fffffffffffffeb8);
              LumImage::~LumImage((LumImage *)0x22bc5a);
            }
          }
          else {
            IVar3 = ImageView::format((ImageView *)&stack0x00000008);
            iVar4 = RedIndex(IVar3);
            IVar3 = ImageView::format((ImageView *)&stack0x00000008);
            iVar5 = GreenIndex(IVar3);
            IVar3 = ImageView::format((ImageView *)&stack0x00000008);
            iVar6 = BlueIndex(IVar3);
            projection.g = iVar6;
            projection.r = iVar5;
            projection.b = in_stack_ffffffffffffff28;
            ExtractLum<ZXing::SetupLumImageView(ZXing::ImageView,ZXing::LumImage&,ZXing::ReaderOptions_const&)::__3>
                      ((ImageView *)CONCAT44(iVar4,in_stack_ffffffffffffff08),projection);
            LumImage::operator=((LumImage *)this_00,in_stack_fffffffffffffeb8);
            LumImage::~LumImage((LumImage *)0x22bc1e);
          }
        }
      }
    }
    puVar7 = LumImage::data((LumImage *)0x22bc6f);
    if (puVar7 != (uint8_t *)0x0) {
      this_00->_data = (uint8_t *)*local_8;
      uVar1 = local_8[1];
      this_00->_format = (int)uVar1;
      this_00->_width = (int)((ulong)uVar1 >> 0x20);
      uVar1 = local_8[2];
      this_00->_height = (int)uVar1;
      this_00->_pixStride = (int)((ulong)uVar1 >> 0x20);
      *(undefined8 *)&this_00->_rowStride = local_8[3];
      return in_RDI;
    }
  }
  this_00->_data = in_stack_00000008;
  this_00->_format = IStack0000000000000010;
  this_00->_width = iStack0000000000000014;
  this_00->_height = iStack0000000000000018;
  this_00->_pixStride = iStack000000000000001c;
  this_00->_rowStride = iStack0000000000000020;
  *(undefined4 *)&this_00->field_0x1c = uStack0000000000000024;
  return in_RDI;
}

Assistant:

ImageView SetupLumImageView(ImageView iv, LumImage& lum, const ReaderOptions& opts)
{
	if (iv.format() == ImageFormat::None)
		throw std::invalid_argument("Invalid image format");

	if (opts.binarizer() == Binarizer::GlobalHistogram || opts.binarizer() == Binarizer::LocalAverage) {
		// manually spell out the 3 most common pixel formats to get at least gcc to vectorize the code
		if (iv.format() == ImageFormat::RGB && iv.pixStride() == 3) {
			lum = ExtractLum(iv, [](const uint8_t* src) { return RGBToLum(src[0], src[1], src[2]); });
		} else if (iv.format() == ImageFormat::RGBA && iv.pixStride() == 4) {
			lum = ExtractLum(iv, [](const uint8_t* src) { return RGBToLum(src[0], src[1], src[2]); });
		} else if (iv.format() == ImageFormat::BGR && iv.pixStride() == 3) {
			lum = ExtractLum(iv, [](const uint8_t* src) { return RGBToLum(src[2], src[1], src[0]); });
		} else if (iv.format() != ImageFormat::Lum) {
			lum = ExtractLum(iv, [r = RedIndex(iv.format()), g = GreenIndex(iv.format()), b = BlueIndex(iv.format())](
									 const uint8_t* src) { return RGBToLum(src[r], src[g], src[b]); });
		} else if (iv.pixStride() != 1) {
			// GlobalHistogram and LocalAverage need dense line memory layout
			lum = ExtractLum(iv, [](const uint8_t* src) { return *src; });
		}
		if (lum.data())
			return lum;
	}
	return iv;
}